

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_graph_manager.hpp
# Opt level: O3

void __thiscall duckdb::QueryGraphManager::~QueryGraphManager(QueryGraphManager *this)

{
  pointer prVar1;
  _Head_base<0UL,_duckdb::JoinRelationSet_*,_false> _Var2;
  pointer *__ptr;
  
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::QueryGraphEdges::QueryEdge,_std::default_delete<duckdb::QueryGraphEdges::QueryEdge>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::QueryGraphEdges::QueryEdge,_std::default_delete<duckdb::QueryGraphEdges::QueryEdge>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->query_graph).root.children._M_h);
  ::std::
  vector<duckdb::unique_ptr<duckdb::NeighborInfo,_std::default_delete<duckdb::NeighborInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::NeighborInfo,_std::default_delete<duckdb::NeighborInfo>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::NeighborInfo,_std::default_delete<duckdb::NeighborInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::NeighborInfo,_std::default_delete<duckdb::NeighborInfo>,_true>_>_>
             *)&this->query_graph);
  ::std::
  vector<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>_>_>
  ::~vector(&(this->filters_and_bindings).
             super_vector<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>_>_>
           );
  prVar1 = (this->filter_operators).
           super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (prVar1 != (pointer)0x0) {
    operator_delete(prVar1);
  }
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::JoinRelationSetManager::JoinRelationTreeNode,_std::default_delete<duckdb::JoinRelationSetManager::JoinRelationTreeNode>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::JoinRelationSetManager::JoinRelationTreeNode,_std::default_delete<duckdb::JoinRelationSetManager::JoinRelationTreeNode>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->set_manager).root.children._M_h);
  _Var2._M_head_impl =
       *(JoinRelationSet **)
        &(this->set_manager).root.relation.
         super_unique_ptr<duckdb::JoinRelationSet,_std::default_delete<duckdb::JoinRelationSet>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::JoinRelationSet,_std::default_delete<duckdb::JoinRelationSet>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::JoinRelationSet_*,_std::default_delete<duckdb::JoinRelationSet>_>
  ;
  if ((_Head_base<0UL,_duckdb::JoinRelationSet_*,_false>)_Var2._M_head_impl !=
      (_Head_base<0UL,_duckdb::JoinRelationSet_*,_false>)0x0) {
    if (*(void **)&(_Var2._M_head_impl)->relations != (void *)0x0) {
      operator_delete__(*(void **)&(_Var2._M_head_impl)->relations);
    }
    operator_delete(_Var2._M_head_impl);
  }
  (this->set_manager).root.relation.
  super_unique_ptr<duckdb::JoinRelationSet,_std::default_delete<duckdb::JoinRelationSet>_>._M_t.
  super___uniq_ptr_impl<duckdb::JoinRelationSet,_std::default_delete<duckdb::JoinRelationSet>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::JoinRelationSet_*,_std::default_delete<duckdb::JoinRelationSet>_>
       = (_Tuple_impl<0UL,_duckdb::JoinRelationSet_*,_std::default_delete<duckdb::JoinRelationSet>_>
         )0x0;
  ::std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->relation_manager).no_cross_product_relations._M_h);
  ::std::
  vector<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
  ::~vector(&(this->relation_manager).relations.
             super_vector<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
           );
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)this);
  return;
}

Assistant:

explicit QueryGraphManager(ClientContext &context) : relation_manager(context), context(context) {
	}